

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O1

void __thiscall
cppnet::SingletonLogger::SetLogger(SingletonLogger *this,shared_ptr<cppnet::Logger> *log)

{
  element_type *peVar1;
  element_type *peVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_8;
  
  peVar1 = (this->_logger).super___shared_ptr<cppnet::BaseLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  peVar2 = (log->super___shared_ptr<cppnet::Logger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_8._M_pi =
       (log->super___shared_ptr<cppnet::Logger,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_8._M_pi)->_M_use_count = (local_8._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_8._M_pi)->_M_use_count = (local_8._M_pi)->_M_use_count + 1;
    }
  }
  (peVar1->_logger).super___shared_ptr<cppnet::Logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(peVar1->_logger).super___shared_ptr<cppnet::Logger,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,&local_8);
  if (local_8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_8._M_pi);
  }
  return;
}

Assistant:

void SingletonLogger::SetLogger(std::shared_ptr<Logger> log) {
    _logger->SetLogger(log);
}